

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
          (string *__return_storage_ptr__,internal *this,path *value,path *param_2)

{
  path *param_1_local;
  path *value_local;
  
  PrintToString<std::filesystem::__cxx11::path>(__return_storage_ptr__,(path *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}